

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O2

Map_Tile * __thiscall Map::GetTile(Map *this,uchar x,uchar y)

{
  out_of_range *this_00;
  
  if ((x < this->width) && (y < this->height)) {
    return (this->tiles).super__Vector_base<Map_Tile,_std::allocator<Map_Tile>_>._M_impl.
           super__Vector_impl_data._M_start + (ulong)this->width * (ulong)y + (ulong)x;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"Map tile out of range");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

bool Map::InBounds(unsigned char x, unsigned char y) const
{
	return !(x >= this->width || y >= this->height);
}